

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

bool __thiscall
icu_63::RBBITableBuilder::findDuplCharClassFrom(RBBITableBuilder *this,IntPair *categories)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  short sVar7;
  int32_t iVar8;
  int iVar9;
  void *pvVar10;
  short sVar11;
  
  iVar2 = this->fDStates->count;
  iVar8 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  iVar1 = iVar8 + -1;
  iVar9 = categories->first;
  iVar6 = iVar9 - iVar1;
  do {
    bVar4 = SBORROW4(iVar9,iVar1) != iVar6 < 0;
    if (SBORROW4(iVar9,iVar1) == iVar6 < 0) {
      return bVar4;
    }
    while (categories->second = iVar9 + 1, iVar9 + 1 < iVar8) {
      if (0 < iVar2) {
        iVar9 = 1;
        do {
          pvVar10 = UVector::elementAt(this->fDStates,iVar9 + -1);
          lVar3 = *(long *)((long)pvVar10 + 0x28);
          iVar6 = categories->first;
          sVar11 = 0;
          if ((-1 < (long)iVar6) &&
             (sVar11 = 0, iVar6 < *(int *)(lVar3 + 8) && 0 < *(int *)(lVar3 + 8))) {
            sVar11 = (short)*(undefined4 *)(*(long *)(lVar3 + 0x18) + (long)iVar6 * 4);
          }
          iVar6 = categories->second;
          sVar7 = 0;
          if ((-1 < (long)iVar6) &&
             (sVar7 = 0, iVar6 < *(int *)(lVar3 + 8) && 0 < *(int *)(lVar3 + 8))) {
            sVar7 = (short)*(undefined4 *)(*(long *)(lVar3 + 0x18) + (long)iVar6 * 4);
          }
        } while ((sVar7 == sVar11) && (bVar5 = iVar9 < iVar2, iVar9 = iVar9 + 1, bVar5));
        if (sVar7 == sVar11) {
          return bVar4;
        }
      }
      iVar9 = categories->second;
    }
    iVar9 = categories->first + 1;
    categories->first = iVar9;
    iVar6 = iVar9 - iVar1;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplCharClassFrom(IntPair *categories) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; categories->first < numCols-1; categories->first++) {
        for (categories->second=categories->first+1; categories->second < numCols; categories->second++) {
            // Initialized to different values to prevent returning true if numStates = 0 (implies no duplicates).
            uint16_t table_base = 0;
            uint16_t table_dupl = 1;
            for (int32_t state=0; state<numStates; state++) {
                RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
                table_base = (uint16_t)sd->fDtran->elementAti(categories->first);
                table_dupl = (uint16_t)sd->fDtran->elementAti(categories->second);
                if (table_base != table_dupl) {
                    break;
                }
            }
            if (table_base == table_dupl) {
                return true;
            }
        }
    }
    return false;
}